

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.cxx
# Opt level: O1

void __thiscall vigra::BmpDecoderImpl::read_rgb_data(BmpDecoderImpl *this)

{
  bool bVar1;
  uint uVar2;
  undefined1 uVar3;
  _Ios_Seekdir _Var4;
  undefined1 *puVar5;
  int iVar6;
  int iVar7;
  ulong new_capacity;
  undefined1 *puVar8;
  
  uVar2 = (this->info_header).width * 3;
  new_capacity = (ulong)((this->info_header).height * uVar2);
  std::istream::seekg((long)this,(this->file_header).offset);
  void_vector_base::reserve(&(this->pixels).super_void_vector_base,new_capacity);
  (this->pixels).super_void_vector_base.m_size = (this->pixels).super_void_vector_base.m_capacity;
  iVar7 = (this->info_header).height;
  if (0 < iVar7) {
    _Var4 = 4 - (uVar2 & 3);
    if ((uVar2 & 3) == 0) {
      _Var4 = _S_beg;
    }
    puVar5 = (undefined1 *)
             ((long)(this->pixels).super_void_vector_base.m_data + (new_capacity - uVar2) + 2);
    do {
      if (0 < (this->info_header).width) {
        iVar6 = 0;
        puVar8 = puVar5;
        do {
          uVar3 = std::istream::get();
          *puVar8 = uVar3;
          uVar3 = std::istream::get();
          puVar8[-1] = uVar3;
          uVar3 = std::istream::get();
          puVar8[-2] = uVar3;
          iVar6 = iVar6 + 1;
          puVar8 = puVar8 + 3;
        } while (iVar6 < (this->info_header).width);
      }
      std::istream::seekg((long)this,_Var4);
      puVar5 = puVar5 + -(ulong)uVar2;
      bVar1 = 1 < iVar7;
      iVar7 = iVar7 + -1;
    } while (bVar1);
  }
  return;
}

Assistant:

void BmpDecoderImpl::read_rgb_data ()
{
    const unsigned int line_size = 3 * info_header.width;
    const unsigned int image_size = info_header.height * line_size;

    // seek to the data
    stream.seekg( file_header.offset, std::ios::beg );

    // make room for the pixels
    pixels.resize(image_size);

    // padding after each scanline.
    // citing Kevin D. Quitt's mail to wotsit.org:
    // In RGB encoding (no compression), when using 8 bits per pixel, lines
    // must start on a long-word boundary (i.e., low two bits zero).
    const unsigned int pad_size = (line_size % 4) ? 4 - (line_size % 4) : 0;

    // setup the base pointer at one line after the end
    UInt8 * base = pixels.data() + image_size;
    UInt8 * mover;

    // read scanlines from bottom to top
    for ( int y = info_header.height - 1; y >= 0; --y ) {

        // set the base pointer to the beginning of the line to be read
        base -= line_size;
        mover = base;

        // read the line from left to right
        for ( int x = 0; x < info_header.width; ++x ) {
            mover[2] = stream.get(); // B
            mover[1] = stream.get(); // G
            mover[0] = stream.get(); // R
            mover += 3;
        }

        // advance to the next 32 bit boundary
        stream.seekg( pad_size, std::ios::cur );
    }
}